

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::ImageDataParameter::Clear(ImageDataParameter *this)

{
  uint uVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_c1;
  LogMessage local_c0;
  LogMessage local_88;
  LogMessage local_50;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      if ((this->source_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x6dbb);
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_50,
                            "CHECK failed: !source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar3);
        google::protobuf::internal::LogMessage::~LogMessage(&local_50);
      }
      psVar2 = (this->source_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
      if ((this->mean_file_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_88,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x6dbf);
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_88,
                            "CHECK failed: !mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar3);
        google::protobuf::internal::LogMessage::~LogMessage(&local_88);
      }
      psVar2 = (this->mean_file_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_).has_bits_[0] & 4) != 0) {
      if ((this->root_folder_).ptr_ ==
          (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x6dc3);
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_c0,
                            "CHECK failed: !root_folder_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_c1,pLVar3);
        google::protobuf::internal::LogMessage::~LogMessage(&local_c0);
      }
      psVar2 = (this->root_folder_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf8) != 0) {
    this->crop_size_ = 0;
    this->rand_skip_ = 0;
    this->shuffle_ = false;
    this->mirror_ = false;
    *(undefined2 *)&this->field_0x3a = 0;
    this->new_height_ = 0;
  }
  if ((uVar1 & 0xf00) != 0) {
    this->new_width_ = 0;
    this->is_color_ = true;
    this->scale_ = 1.0;
    this->batch_size_ = 1;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void ImageDataParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.ImageDataParameter)
  if (_has_bits_[0 / 32] & 7u) {
    if (has_source()) {
      GOOGLE_DCHECK(!source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*source_.UnsafeRawStringPointer())->clear();
    }
    if (has_mean_file()) {
      GOOGLE_DCHECK(!mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*mean_file_.UnsafeRawStringPointer())->clear();
    }
    if (has_root_folder()) {
      GOOGLE_DCHECK(!root_folder_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*root_folder_.UnsafeRawStringPointer())->clear();
    }
  }
  if (_has_bits_[0 / 32] & 248u) {
    ::memset(&crop_size_, 0, reinterpret_cast<char*>(&new_height_) -
      reinterpret_cast<char*>(&crop_size_) + sizeof(new_height_));
  }
  if (_has_bits_[8 / 32] & 3840u) {
    new_width_ = 0u;
    is_color_ = true;
    scale_ = 1;
    batch_size_ = 1u;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}